

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void in_memory_snapshot_cleanup_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc_00;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  size_t sVar7;
  char *handle;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_kvs_handle *doc_01;
  fdb_iterator *doc_02;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *in_RCX;
  fdb_kvs_handle *extraout_RDX;
  char *pcVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *doc_03;
  uint uVar14;
  fdb_kvs_handle *unaff_RBP;
  __atomic_base<unsigned_long> _Var15;
  fdb_iterator *pfVar16;
  char *unaff_R12;
  char *unaff_R13;
  long lVar17;
  __atomic_base<unsigned_long> handle_00;
  ulong uVar18;
  fdb_doc **doc_04;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db3;
  fdb_kvs_handle *snap_db2;
  fdb_kvs_handle *snap_db1;
  fdb_kvs_handle *psnap_db3;
  fdb_kvs_handle *psnap_db2;
  fdb_kvs_handle *psnap_db1;
  fdb_kvs_config kvs_config;
  char bodybuf [32];
  char metabuf [32];
  char keybuf [32];
  timeval __test_begin;
  char newKey [32];
  fdb_config fconfig;
  fdb_doc *pfStack_1298;
  fdb_iterator *pfStack_1290;
  int iStack_1284;
  fdb_kvs_handle *pfStack_1280;
  timeval tStack_1278;
  fdb_kvs_handle *pfStack_1268;
  fdb_kvs_handle *pfStack_1260;
  fdb_kvs_handle *pfStack_1258;
  fdb_kvs_handle *pfStack_1250;
  fdb_iterator *pfStack_1248;
  fdb_iterator *pfStack_1240;
  fdb_kvs_handle *pfStack_1230;
  fdb_kvs_handle *pfStack_1228;
  undefined1 auStack_1220 [24];
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  fdb_kvs_handle *pfStack_11f0;
  undefined1 auStack_11e8 [80];
  undefined8 auStack_1198 [5];
  fdb_doc *apfStack_1170 [6];
  fdb_kvs_info fStack_1140;
  timeval tStack_1110;
  undefined1 auStack_1100 [280];
  fdb_iterator fStack_fe8;
  fdb_kvs_handle fStack_ee8;
  fdb_kvs_handle *pfStack_ce0;
  fdb_kvs_handle *pfStack_cd8;
  fdb_kvs_handle *pfStack_cd0;
  code *pcStack_cc8;
  fdb_kvs_handle *pfStack_cb8;
  fdb_iterator *pfStack_cb0;
  fdb_kvs_handle *pfStack_ca8;
  fdb_kvs_handle *pfStack_ca0;
  fdb_custom_cmp_variable *pp_Stack_c98;
  size_t sStack_c90;
  fdb_kvs_handle *pfStack_c88;
  fdb_kvs_info fStack_c80;
  undefined1 auStack_c50 [10];
  undefined1 auStack_c46 [14];
  undefined2 uStack_c38;
  fdb_encryption_key afStack_b40 [7];
  fdb_kvs_handle *pfStack_a38;
  fdb_kvs_handle *pfStack_a30;
  fdb_kvs_handle *pfStack_a28;
  fdb_kvs_handle *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_kvs_handle *pfStack_a10;
  undefined1 auStack_a00 [8];
  fdb_file_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_kvs_handle *pfStack_9e8;
  fdb_iterator *pfStack_9e0;
  undefined1 auStack_9d8 [48];
  undefined1 auStack_9a8 [64];
  hbtrie *phStack_968;
  kvs_ops_stat *pkStack_960;
  timeval tStack_938;
  btreeblk_handle *apbStack_928 [33];
  undefined1 auStack_820 [32];
  undefined2 uStack_800;
  undefined1 uStack_7e0;
  code *pcStack_7c8;
  undefined4 uStack_7c0;
  fdb_txn *pfStack_7b8;
  fdb_kvs_handle *pfStack_728;
  char acStack_720 [256];
  fdb_kvs_handle *pfStack_620;
  fdb_kvs_handle *pfStack_618;
  fdb_kvs_handle *pfStack_610;
  fdb_kvs_handle *pfStack_608;
  fdb_kvs_handle *pfStack_600;
  fdb_kvs_handle *pfStack_5f8;
  fdb_kvs_handle *pfStack_5e8;
  uint uStack_5dc;
  fdb_iterator *pfStack_5d8;
  fdb_kvs_handle *pfStack_5d0;
  undefined4 *puStack_5c8;
  fdb_kvs_handle *pfStack_5c0;
  fdb_kvs_handle *pfStack_5b8;
  fdb_iterator *pfStack_5b0;
  fdb_file_handle *pfStack_5a8;
  fdb_iterator *pfStack_5a0;
  size_t sStack_598;
  undefined1 auStack_590 [32];
  timeval tStack_570;
  undefined1 auStack_560 [272];
  size_t sStack_450;
  char *pcStack_448;
  uint8_t uStack_440;
  undefined2 uStack_438;
  undefined1 uStack_418;
  fdb_kvs_handle *pfStack_360;
  char acStack_358 [256];
  fdb_doc **ppfStack_258;
  fdb_kvs_handle *pfStack_250;
  fdb_kvs_handle *pfStack_248;
  fdb_kvs_handle *pfStack_240;
  fdb_kvs_handle *pfStack_238;
  fdb_kvs_handle *pfStack_230;
  fdb_kvs_handle *local_220;
  fdb_file_handle *local_218;
  fdb_doc *local_210;
  fdb_doc *local_208;
  fdb_kvs_handle *local_200;
  fdb_kvs_handle *local_1f8;
  fdb_kvs_handle *local_1f0;
  fdb_kvs_handle *local_1e8;
  fdb_kvs_handle *local_1e0;
  fdb_kvs_handle *local_1d8;
  fdb_kvs_config local_1d0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [80];
  undefined1 local_148 [48];
  hbtrie *local_118;
  undefined4 local_104;
  uint8_t local_f9;
  char *local_70;
  
  handle = (char *)0x0;
  pfStack_230 = (fdb_kvs_handle *)0x112291;
  gettimeofday((timeval *)(local_198 + 0x40),(__timezone_ptr_t)0x0);
  pfStack_230 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  local_210 = (fdb_doc *)0x0;
  pcVar12 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_230 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)(local_148 + 0x20);
  pfStack_230 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_230 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  local_118 = (hbtrie *)0x400;
  local_104 = 1;
  local_f9 = '\0';
  local_70 = (char *)0x0;
  pfStack_230 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_230 = (fdb_kvs_handle *)0x1122fc;
  fVar4 = fdb_open(&local_218,"./mvcc_test1",(fdb_config *)pfVar13);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_230 = (fdb_kvs_handle *)0x112318;
    fVar4 = fdb_kvs_open_default(local_218,&local_220,&local_1d0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_230 = (fdb_kvs_handle *)0x112338;
    fVar4 = fdb_set_log_callback(local_220,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar12 = local_198 + 0x20;
    local_198._32_4_ = 0x79656b;
    pfVar13 = (fdb_kvs_handle *)local_198;
    local_198[4] = 0;
    local_198._0_4_ = 0x6174656d;
    handle = local_1b8;
    local_1b8[4] = 0;
    local_1b8._0_4_ = 0x79646f62;
    pfStack_230 = (fdb_kvs_handle *)0x11237b;
    unaff_R12 = (char *)strlen(pcVar12);
    pfStack_230 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar13);
    pfStack_230 = (fdb_kvs_handle *)0x112391;
    sVar7 = strlen(handle);
    unaff_RBP = (fdb_kvs_handle *)&local_210;
    pfStack_230 = (fdb_kvs_handle *)0x1123b1;
    in_RCX = pfVar13;
    fdb_doc_create((fdb_doc **)unaff_RBP,pcVar12,(size_t)unaff_R12,pfVar13,(size_t)unaff_R13,handle,
                   sVar7);
    pfStack_230 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(local_220,local_210);
    pfStack_230 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(local_218,'\0');
    pfStack_230 = (fdb_kvs_handle *)0x1123e1;
    fVar4 = fdb_snapshot_open(local_220,&local_1f0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_230 = (fdb_kvs_handle *)0x1123f8;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_230 = (fdb_kvs_handle *)0x11240c;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_230 = (fdb_kvs_handle *)0x11242a;
    fVar4 = fdb_snapshot_open(local_220,&local_1f8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_230 = (fdb_kvs_handle *)0x112441;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_230 = (fdb_kvs_handle *)0x112455;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_230 = (fdb_kvs_handle *)0x11246c;
    fVar4 = fdb_set(local_220,local_210);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_230 = (fdb_kvs_handle *)0x112480;
    fVar4 = fdb_commit(local_218,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar12 = (char *)&local_210;
    pfStack_230 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free(local_210);
    pfVar13 = (fdb_kvs_handle *)local_148;
    local_148._0_4_ = 0x79654b;
    pfStack_230 = (fdb_kvs_handle *)0x1124ac;
    handle = (char *)strlen((char *)pfVar13);
    unaff_R12 = local_198;
    pfStack_230 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP = (fdb_kvs_handle *)local_1b8;
    pfStack_230 = (fdb_kvs_handle *)0x1124cf;
    sVar7 = strlen((char *)unaff_RBP);
    pfStack_230 = (fdb_kvs_handle *)0x1124ea;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar12,pfVar13,(size_t)handle,unaff_R12,(size_t)unaff_R13,unaff_RBP,
                   sVar7);
    pfStack_230 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(local_220,local_210);
    pfStack_230 = (fdb_kvs_handle *)0x11250d;
    fVar4 = fdb_snapshot_open(local_220,&local_200,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar12 = local_198 + 0x20;
    pfStack_230 = (fdb_kvs_handle *)0x112525;
    sVar7 = strlen(pcVar12);
    pfVar13 = (fdb_kvs_handle *)&local_208;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_230 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar13,pcVar12,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_230 = (fdb_kvs_handle *)0x112555;
    fVar4 = fdb_get(local_1f0,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_230 = (fdb_kvs_handle *)0x11256c;
    fVar4 = fdb_get(local_1f8,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_230 = (fdb_kvs_handle *)0x112583;
    fVar4 = fdb_get(local_200,local_208);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_230 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(local_208);
    pfStack_230 = (fdb_kvs_handle *)0x1125a9;
    fVar4 = fdb_snapshot_open(local_220,&local_1d8,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_230 = (fdb_kvs_handle *)0x1125c5;
    fVar4 = fdb_snapshot_open(local_220,&local_1e0,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_230 = (fdb_kvs_handle *)0x1125e1;
    fVar4 = fdb_snapshot_open(local_220,&local_1e8,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_230 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(local_1f0);
    pfStack_230 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(local_1f8);
    pfStack_230 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(local_200);
    pfStack_230 = (fdb_kvs_handle *)0x112616;
    fVar4 = fdb_commit(local_218,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_230 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(local_1d8);
      pfStack_230 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(local_1e0);
      pfStack_230 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(local_1e8);
      pfStack_230 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(local_220);
      pfStack_230 = (fdb_kvs_handle *)0x112650;
      fdb_close(local_218);
      pfStack_230 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free(local_210);
      pfStack_230 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_230 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_230 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar12,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_230 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_230 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_230 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_230 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_230 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_230 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_230 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_230 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_230 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_230 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_230 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_230 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_230 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_230 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_230 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_230 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_230 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_230 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_230 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_5f8 = (fdb_kvs_handle *)0x112726;
  ppfStack_258 = (fdb_doc **)pcVar12;
  pfStack_250 = (fdb_kvs_handle *)unaff_R12;
  pfStack_248 = (fdb_kvs_handle *)unaff_R13;
  pfStack_240 = pfVar13;
  pfStack_238 = (fdb_kvs_handle *)handle;
  pfStack_230 = unaff_RBP;
  gettimeofday(&tStack_570,(__timezone_ptr_t)0x0);
  pfStack_360 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_358,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_5f8 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_360);
  pfStack_5f8 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_5f8 = (fdb_kvs_handle *)0x11275d;
  pfVar8 = (fdb_kvs_handle *)malloc(0x20);
  pfVar13 = (fdb_kvs_handle *)(auStack_560 + 0x108);
  pfStack_5f8 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_438._0_1_ = true;
  uStack_438._1_1_ = true;
  uStack_440 = '\x01';
  pcStack_448 = (char *)0x3c;
  uStack_418 = 1;
  sStack_450 = 0;
  pfStack_5f8 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_5f8 = (fdb_kvs_handle *)0x1127af;
  fVar4 = fdb_open(&pfStack_5a8,"./mvcc_test",(fdb_config *)pfVar13);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fd5;
  in_RCX = (fdb_kvs_handle *)(auStack_590 + 8);
  pfStack_5f8 = (fdb_kvs_handle *)0x1127d2;
  fVar4 = fdb_kvs_open(pfStack_5a8,&pfStack_5c0,"db",(fdb_kvs_config *)in_RCX);
  pcVar12 = (char *)pfVar13;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
  puStack_5c8 = (undefined4 *)((long)&pfVar8->kvs + 2);
  pcVar12 = "k%05d";
  handle = auStack_560;
  unaff_R12 = "value%08d";
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_5f8 = (fdb_kvs_handle *)0x11280d;
    sprintf(handle,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar8->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x11283b;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    unaff_R13 = (char *)pfStack_5c0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112848;
    sVar7 = strlen(handle);
    pfStack_5f8 = (fdb_kvs_handle *)0x112860;
    in_RCX = pfVar8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar8,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
    uVar14 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
  } while (uVar14 != 0x1e);
  pfStack_5f8 = (fdb_kvs_handle *)0x11287e;
  fVar4 = fdb_commit(pfStack_5a8,'\x01');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
  pfStack_5f8 = (fdb_kvs_handle *)0x11289c;
  fVar4 = fdb_snapshot_open(pfStack_5c0,&pfStack_5d0,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
  pfStack_5f8 = (fdb_kvs_handle *)0x1128ba;
  fVar4 = fdb_snapshot_open(pfStack_5d0,&pfStack_5b8,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
  unaff_RBP = (fdb_kvs_handle *)0x1e;
  pcVar12 = "k%05d";
  handle = auStack_560;
  unaff_R12 = "value%08d";
  do {
    pfStack_5f8 = (fdb_kvs_handle *)0x1128ec;
    sprintf(handle,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar8->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x11291a;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    unaff_R13 = (char *)pfStack_5c0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112927;
    sVar7 = strlen(handle);
    pfStack_5f8 = (fdb_kvs_handle *)0x11293f;
    in_RCX = pfVar8;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar7 + 1,pfVar8,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
    uVar14 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
  } while (uVar14 != 300);
  pfStack_5f8 = (fdb_kvs_handle *)0x11296f;
  sprintf((char *)auStack_560,"k%05d",0x1e);
  handle = (char *)pfStack_5d0;
  pfStack_5f8 = (fdb_kvs_handle *)0x11297c;
  sVar7 = strlen((char *)auStack_560);
  in_RCX = (fdb_kvs_handle *)auStack_590;
  pfStack_5f8 = (fdb_kvs_handle *)0x112995;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_560,sVar7 + 1,
                     (void **)in_RCX,&sStack_598);
  pcVar12 = (char *)pfStack_5b8;
  pfVar13 = (fdb_kvs_handle *)auStack_560;
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
  handle = auStack_560;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129b2;
  sVar7 = strlen(handle);
  in_RCX = (fdb_kvs_handle *)auStack_590;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129cb;
  fVar4 = fdb_get_kv((fdb_kvs_handle *)pcVar12,handle,sVar7 + 1,(void **)in_RCX,&sStack_598);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129dd;
  fVar4 = fdb_kvs_close(pfStack_5d0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
  pfStack_5f8 = (fdb_kvs_handle *)0x1129ef;
  fVar4 = fdb_kvs_close(pfStack_5b8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
  pfStack_5f8 = (fdb_kvs_handle *)0x112a0d;
  fVar4 = fdb_snapshot_open(pfStack_5c0,&pfStack_5d0,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113002;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112a35;
  fVar4 = fdb_iterator_init(pfStack_5d0,&pfStack_5d8,(void *)0x0,0,(void *)0x0,0,0);
  pfVar13 = (fdb_kvs_handle *)pcVar12;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113007;
  unaff_R12 = auStack_560;
  unaff_R13 = "value%08d";
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112a66;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    pfVar13 = (fdb_kvs_handle *)pcVar12;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_5f8 = (fdb_kvs_handle *)0x112a81;
    sprintf(unaff_R12,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar8->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112aaf;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    pcVar12 = (char *)pfStack_5e8;
    handle = (char *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ac6;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00112f5a;
    handle = (char *)(((fdb_kvs_handle *)pcVar12)->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ae1;
    iVar5 = bcmp(handle,pfVar8,(size_t)(((fdb_kvs_handle *)pcVar12)->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112f6a;
    unaff_RBP = (fdb_kvs_handle *)(ulong)((int)unaff_RBP + 1);
    pfStack_5f8 = (fdb_kvs_handle *)0x112af3;
    fdb_doc_free((fdb_doc *)pcVar12);
    pfStack_5f8 = (fdb_kvs_handle *)0x112afd;
    fVar4 = fdb_iterator_next(pfStack_5d8);
    pfVar13 = (fdb_kvs_handle *)pcVar12;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP != 300) goto LAB_0011300c;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b1b;
  fVar4 = fdb_iterator_close(pfStack_5d8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113011;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b39;
  fVar4 = fdb_snapshot_open(pfStack_5d0,&pfStack_5b8,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113016;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b61;
  fVar4 = fdb_iterator_init(pfStack_5d0,&pfStack_5d8,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112b89;
  fVar4 = fdb_iterator_init(pfStack_5b8,&pfStack_5a0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113020;
  in_RCX = (fdb_kvs_handle *)0x0;
  pfStack_5f8 = (fdb_kvs_handle *)0x112bb1;
  fVar4 = fdb_iterator_init(pfStack_5c0,&pfStack_5b0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113025;
  unaff_R12 = auStack_560;
  unaff_R13 = "value%08d";
  handle = "k%06d";
  uStack_5dc = 0;
  do {
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112bef;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    uVar14 = uStack_5dc;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c0e;
    sprintf(unaff_R12,"k%05d",(ulong)uStack_5dc);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar8->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c3c;
    sprintf((char *)pfVar8,"value%08d",(ulong)uVar14);
    pcVar12 = (char *)pfStack_5e8;
    unaff_RBP = (fdb_kvs_handle *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c53;
    iVar5 = bcmp(unaff_RBP,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00112f75;
    unaff_RBP = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar12)->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c6e;
    iVar5 = bcmp(unaff_RBP,pfVar8,(size_t)(((fdb_kvs_handle *)pcVar12)->kvs_config).custom_cmp_param
                );
    pfVar13 = (fdb_kvs_handle *)pcVar12;
    if (iVar5 != 0) goto LAB_00112fa5;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c7e;
    fdb_doc_free((fdb_doc *)pcVar12);
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112c96;
    fVar4 = fdb_iterator_get(pfStack_5d8,(fdb_doc **)&pfStack_5e8);
    pfVar13 = pfStack_5e8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
    unaff_RBP = (fdb_kvs_handle *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112cb5;
    iVar5 = bcmp(unaff_RBP,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00112f8a;
    unaff_RBP = (fdb_kvs_handle *)(pfVar13->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112cd0;
    iVar5 = bcmp(unaff_RBP,pfVar8,(size_t)(pfVar13->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112f9a;
    uVar14 = uStack_5dc + 1;
    unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
    pfStack_5f8 = (fdb_kvs_handle *)0x112ce6;
    fdb_doc_free((fdb_doc *)pfVar13);
    uStack_5dc = uVar14;
    if (uVar14 == 0x3c) {
      pcVar12 = (char *)0x0;
      do {
        pfStack_5f8 = (fdb_kvs_handle *)0x112d02;
        sprintf(unaff_R12,"k%06d",pcVar12);
        *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar8->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
        *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
        *puStack_5c8 = 0x646e653c;
        pfStack_5f8 = (fdb_kvs_handle *)0x112d31;
        sprintf((char *)pfVar8,"value%08d",pcVar12);
        unaff_RBP = pfStack_5c0;
        pfStack_5f8 = (fdb_kvs_handle *)0x112d3e;
        sVar7 = strlen(unaff_R12);
        pfStack_5f8 = (fdb_kvs_handle *)0x112d56;
        in_RCX = pfVar8;
        fVar4 = fdb_set_kv(unaff_RBP,unaff_R12,sVar7 + 1,pfVar8,0x20);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_5f8 = (fdb_kvs_handle *)0x112f50;
          in_memory_snapshot_on_dirty_hbtrie_test();
          goto LAB_00112f50;
        }
        uVar14 = (int)pcVar12 + 1;
        pcVar12 = (char *)(ulong)uVar14;
      } while (uVar14 != 3000);
    }
    pfStack_5f8 = (fdb_kvs_handle *)0x112d74;
    fVar4 = fdb_iterator_next(pfStack_5d8);
    pfVar13 = (fdb_kvs_handle *)(ulong)(uint)fVar4;
    pfStack_5f8 = (fdb_kvs_handle *)0x112d81;
    fVar6 = fdb_iterator_next(pfStack_5a0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
    }
    else if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (uStack_5dc != 300) goto LAB_0011302a;
  pfStack_5f8 = (fdb_kvs_handle *)0x112db8;
  fVar4 = fdb_iterator_close(pfStack_5d8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
  pfStack_5f8 = (fdb_kvs_handle *)0x112dca;
  fVar4 = fdb_iterator_close(pfStack_5a0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113034;
  unaff_R12 = auStack_560;
  unaff_R13 = "value%08d";
  unaff_RBP = (fdb_kvs_handle *)0x0;
  do {
    pfStack_5e8 = (fdb_kvs_handle *)0x0;
    pfStack_5f8 = (fdb_kvs_handle *)0x112dfb;
    fVar4 = fdb_iterator_get(pfStack_5b0,(fdb_doc **)&pfStack_5e8);
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    pfStack_5f8 = (fdb_kvs_handle *)0x112e16;
    sprintf(unaff_R12,"k%05d",unaff_RBP);
    *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar8->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_5c8 + 1) = 0x3e;
    *puStack_5c8 = 0x646e653c;
    pfStack_5f8 = (fdb_kvs_handle *)0x112e44;
    sprintf((char *)pfVar8,"value%08d",unaff_RBP);
    pfVar13 = pfStack_5e8;
    handle = (char *)pfStack_5e8->op_stats;
    pfStack_5f8 = (fdb_kvs_handle *)0x112e5b;
    iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_5e8->kvs_config);
    if (iVar5 != 0) goto LAB_00112fb0;
    handle = (char *)(pfVar13->field_6).seqtree;
    pfStack_5f8 = (fdb_kvs_handle *)0x112e76;
    iVar5 = bcmp(handle,pfVar8,(size_t)(pfVar13->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_00112fc0;
    unaff_RBP = (fdb_kvs_handle *)(ulong)((int)unaff_RBP + 1);
    pfStack_5f8 = (fdb_kvs_handle *)0x112e88;
    fdb_doc_free((fdb_doc *)pfVar13);
    pfStack_5f8 = (fdb_kvs_handle *)0x112e92;
    fVar4 = fdb_iterator_next(pfStack_5b0);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)unaff_RBP != 300) goto LAB_00113039;
  pfStack_5f8 = (fdb_kvs_handle *)0x112eb0;
  fVar4 = fdb_iterator_close(pfStack_5b0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ec2;
  fVar4 = fdb_kvs_close(pfStack_5d0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113043;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ed4;
  fVar4 = fdb_kvs_close(pfStack_5b8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113048;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ee6;
  fVar4 = fdb_close(pfStack_5a8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ef3;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_5f8 = (fdb_kvs_handle *)0x112f03;
    free(pfVar8);
    pfStack_5f8 = (fdb_kvs_handle *)0x112f08;
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    pfStack_5f8 = (fdb_kvs_handle *)0x112f39;
    fprintf(_stderr,pcVar12,"in-memory snapshot on dirty HB+trie nodes test");
    return;
  }
  goto LAB_00113052;
LAB_0011350e:
  pfStack_a10 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_a10 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_a10 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_a10 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_cc8 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_cc8 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_cc8 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar13 = (fdb_kvs_handle *)afStack_b40;
  unaff_R12 = auStack_c46 + 6;
  pcStack_cc8 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_1240 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar11 = pfVar8;
LAB_00114575:
  pfVar8 = pfVar11;
  pfStack_1240 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_1240 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar13 = (fdb_kvs_handle *)&pfStack_1228;
  pfStack_1240 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00112f50:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar13 = (fdb_kvs_handle *)pcVar12;
  pfStack_5f8 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_5f8 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd5:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fda;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pcVar12 = (char *)pfVar13;
LAB_00112fda:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fdf;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fe4;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fe9;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
  pfStack_5f8 = (fdb_kvs_handle *)0x112fee;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar13 = (fdb_kvs_handle *)pcVar12;
LAB_00112fee:
  pcVar12 = (char *)pfVar13;
  pfStack_5f8 = (fdb_kvs_handle *)0x112ff3;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
  pfStack_5f8 = (fdb_kvs_handle *)0x112ff8;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
  pfStack_5f8 = (fdb_kvs_handle *)0x112ffd;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
  pfStack_5f8 = (fdb_kvs_handle *)0x113002;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
  pfStack_5f8 = (fdb_kvs_handle *)0x113007;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar13 = (fdb_kvs_handle *)pcVar12;
LAB_00113007:
  pfStack_5f8 = (fdb_kvs_handle *)0x11300c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
  pfStack_5f8 = (fdb_kvs_handle *)0x113011;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
  pfStack_5f8 = (fdb_kvs_handle *)0x113016;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
  pfStack_5f8 = (fdb_kvs_handle *)0x11301b;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
  pfStack_5f8 = (fdb_kvs_handle *)0x113020;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
  pfStack_5f8 = (fdb_kvs_handle *)0x113025;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
  pfStack_5f8 = (fdb_kvs_handle *)0x11302a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
  pfStack_5f8 = (fdb_kvs_handle *)0x11302f;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
  pfStack_5f8 = (fdb_kvs_handle *)0x113034;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
  pfStack_5f8 = (fdb_kvs_handle *)0x113039;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
  pfStack_5f8 = (fdb_kvs_handle *)0x11303e;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
  pfStack_5f8 = (fdb_kvs_handle *)0x113043;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
  pfStack_5f8 = (fdb_kvs_handle *)0x113048;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
  pfStack_5f8 = (fdb_kvs_handle *)0x11304d;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
  pfStack_5f8 = (fdb_kvs_handle *)0x113052;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113052:
  pfStack_5f8 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_a10 = (fdb_kvs_handle *)0x113077;
  pfStack_620 = pfVar8;
  pfStack_618 = (fdb_kvs_handle *)unaff_R12;
  pfStack_610 = (fdb_kvs_handle *)unaff_R13;
  pfStack_608 = pfVar13;
  pfStack_600 = (fdb_kvs_handle *)handle;
  pfStack_5f8 = unaff_RBP;
  gettimeofday(&tStack_938,(__timezone_ptr_t)0x0);
  auStack_a00._4_2_ = 100;
  auStack_a00._0_4_ = 0x3530256b;
  auStack_9d8._8_2_ = 100;
  auStack_9d8._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_720,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_728 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_a10 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_728);
  pfStack_a10 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_a10 = (fdb_kvs_handle *)0x1130d3;
  pfVar8 = (fdb_kvs_handle *)malloc(0x20);
  pfVar13 = (fdb_kvs_handle *)((long)apbStack_928 + 0x108);
  pfStack_a10 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_800 = 0x201;
  auStack_820[0x18] = '\x01';
  auStack_820._16_8_ = (fdb_txn *)0x2;
  uStack_7e0 = 1;
  auStack_820._8_8_ = (fdb_log_callback)0x0;
  pcStack_7c8 = cb_inmem_snap;
  uStack_7c0 = 2;
  pfStack_7b8 = (fdb_txn *)auStack_9a8;
  pfStack_a10 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_a10 = (fdb_kvs_handle *)0x113144;
  fVar4 = fdb_open(&pfStack_9f8,"./mvcc_test",(fdb_config *)pfVar13);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_9a8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x11316a;
    fVar4 = fdb_kvs_open(pfStack_9f8,(fdb_kvs_handle **)(auStack_9d8 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    in_RCX = (fdb_kvs_handle *)(auStack_9a8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x113190;
    fVar4 = fdb_kvs_open(pfStack_9f8,(fdb_kvs_handle **)(auStack_9d8 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_9a8._0_8_ = auStack_9d8._24_8_;
    auStack_9a8._8_8_ = (btree *)0xa;
    auStack_9a8._24_8_ = auStack_a00;
    handle = auStack_9d8;
    auStack_9a8._16_4_ = 0x20;
    pfVar13 = (fdb_kvs_handle *)((long)&pfVar8->kvs + 2);
    unaff_R12 = (char *)apbStack_928;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    auStack_9a8._32_8_ = handle;
    do {
      pfStack_a10 = (fdb_kvs_handle *)0x1131ec;
      sprintf(unaff_R12,auStack_a00,unaff_RBP);
      *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar8->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar8->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar13->kvs_config = 0x646e653c;
      pfStack_a10 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar8,handle,unaff_RBP);
      unaff_R13 = (char *)auStack_9d8._16_8_;
      pfStack_a10 = (fdb_kvs_handle *)0x113224;
      sVar7 = strlen(unaff_R12);
      pfStack_a10 = (fdb_kvs_handle *)0x11323c;
      in_RCX = pfVar8;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar7 + 1,pfVar8,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_a10 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar14 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar14 != 10);
    pfStack_a10 = (fdb_kvs_handle *)0x11325a;
    fVar4 = fdb_commit(pfStack_9f8,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_a10 = (fdb_kvs_handle *)0x113273;
    fVar4 = fdb_compact(pfStack_9f8,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_a10 = (fdb_kvs_handle *)0x113291;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_9d8._16_8_,&pfStack_9e8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_a10 = (fdb_kvs_handle *)0x1132ab;
    fVar4 = fdb_get_kvs_info(pfStack_9e8,(fdb_kvs_info *)&phStack_968);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_960 != (kvs_ops_stat *)0xb) {
      pfStack_a10 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_a10 = (fdb_kvs_handle *)0x1132eb;
    fVar4 = fdb_iterator_init(pfStack_9e8,&pfStack_9e0,(void *)0x0,0,(void *)0x0,0,0);
    doc_01 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle = (char *)apbStack_928;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_9f0 = (fdb_kvs_handle *)0x0;
      pfStack_a10 = (fdb_kvs_handle *)0x113315;
      fVar4 = fdb_iterator_get(pfStack_9e0,(fdb_doc **)&pfStack_9f0);
      unaff_R13 = (char *)pfStack_9f0;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP < 10) {
        pfStack_a10 = (fdb_kvs_handle *)0x113333;
        sprintf(handle,auStack_a00,unaff_RBP);
        *(undefined4 *)&pfVar8->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar8->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar8->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar8->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar8->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar8->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar13->kvs_config = 0x646e653c;
        pfStack_a10 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar8,auStack_9d8,unaff_RBP);
        unaff_R13 = (char *)pfStack_9f0;
        unaff_R12 = (char *)pfStack_9f0->op_stats;
        pfStack_a10 = (fdb_kvs_handle *)0x113378;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_9f0->kvs_config);
        if (iVar5 != 0) goto LAB_00113529;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_a10 = (fdb_kvs_handle *)0x113393;
        iVar5 = bcmp(unaff_R12,pfVar8,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113539;
      }
      else {
        apbStack_928[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_doc **)&pfVar8->kvs_config = (fdb_doc *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar8->kvs_config).custom_cmp = 0x65;
        unaff_R12 = (char *)pfStack_9f0->op_stats;
        pfStack_a10 = (fdb_kvs_handle *)0x1133d9;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_9f0->kvs_config);
        if (iVar5 != 0) goto LAB_0011350e;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_a10 = (fdb_kvs_handle *)0x1133f4;
        iVar5 = bcmp(unaff_R12,pfVar8,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011351e;
      }
      unaff_RBP = (fdb_kvs_handle *)(ulong)((uint)unaff_RBP + 1);
      pfStack_a10 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_9f0);
      pfStack_a10 = (fdb_kvs_handle *)0x113412;
      fVar4 = fdb_iterator_next(pfStack_9e0);
      doc_01 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP != 0xb) goto LAB_0011356c;
    pfStack_a10 = (fdb_kvs_handle *)0x11342d;
    fVar4 = fdb_iterator_close(pfStack_9e0);
    handle_00._M_i = (__int_type)pfStack_9e8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle = (char *)apbStack_928;
    pfStack_a10 = (fdb_kvs_handle *)0x11344a;
    sVar7 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_9d8 + 0x28);
    pfStack_a10 = (fdb_kvs_handle *)0x113463;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)handle_00._M_i,handle,sVar7 + 1,(void **)in_RCX,
                       (size_t *)(auStack_9d8 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_a10 = (fdb_kvs_handle *)0x113480;
    _Var15._M_i = (__int_type)pfVar8;
    iVar5 = bcmp((void *)auStack_9d8._40_8_,pfVar8,auStack_9d8._32_8_);
    handle_00._M_i = auStack_9d8._40_8_;
    if (iVar5 != 0) goto LAB_0011357b;
    pfStack_a10 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_9d8._40_8_);
    pfStack_a10 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_9e8);
    pfStack_a10 = (fdb_kvs_handle *)0x1134a4;
    fVar4 = fdb_close(pfStack_9f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_a10 = (fdb_kvs_handle *)0x1134b1;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_a10 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar8);
      pfStack_a10 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_a10 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar12,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_a10 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_a10 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_a10 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_a10 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_a10 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_a10 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_a10 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    doc_01 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_a10 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_a10 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    handle_00._M_i = (__int_type)pfVar13;
    pfStack_a10 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_a10 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_a10 = (fdb_kvs_handle *)0x113586;
    _Var15._M_i = handle_00._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_a10 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_a10 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar18 = _Var15._M_i & 0xffffffff;
  pfVar13 = (fdb_kvs_handle *)0x0;
  pcStack_cc8 = (code *)0x1135b8;
  pfStack_a38 = pfVar8;
  pfStack_a30 = (fdb_kvs_handle *)unaff_R12;
  pfStack_a28 = doc_01;
  pfStack_a20 = (fdb_kvs_handle *)handle_00._M_i;
  pfStack_a18 = (fdb_kvs_handle *)handle;
  pfStack_a10 = unaff_RBP;
  gettimeofday((timeval *)auStack_c50,(__timezone_ptr_t)0x0);
  if ((int)_Var15._M_i != 2) {
    return;
  }
  pfVar8 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_cc8 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_cc8 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_cc8 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_cc8 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_cc8 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_cc8 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_cc8 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar11 = pfVar8;
LAB_00113afb:
    pcStack_cc8 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar8 = in_RCX;
    pcStack_cc8 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_cc8 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar8 = (fdb_kvs_handle *)
             CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
    pfVar13 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(pfVar8->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar8->kvs_config).custom_cmp + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_cc8 = (code *)0x113607;
      fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar8->kvs_config,&pfStack_ca8,
                                0xffffffffffffffff);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_cc8 = (code *)0x11361e;
      fVar4 = fdb_get_kvs_info(pfStack_ca8,&fStack_c80);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (fdb_kvs_handle *)&(pfVar8->kvs_config).custom_cmp;
      if (fStack_c80.last_seqnum != (long)*(int *)&(pfVar8->kvs_config).custom_cmp) {
        pcStack_cc8 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_cc8 = (code *)0x113663;
      pfStack_ca0 = pfVar13;
      pp_Stack_c98 = (fdb_custom_cmp_variable *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_ca8,&pfStack_cb0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar8 = (fdb_kvs_handle *)(auStack_c50 + 10);
        pcVar12 = auStack_c46 + 6;
        uVar18 = 0;
        do {
          pfStack_cb8 = (fdb_kvs_handle *)0x0;
          pcStack_cc8 = (code *)0x11369a;
          fVar4 = fdb_iterator_get(pfStack_cb0,(fdb_doc **)&pfStack_cb8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar17 = CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
          pcStack_cc8 = (code *)0x1136ba;
          sprintf((char *)afStack_b40,*(char **)(lVar17 + 0x18),uVar18);
          sVar7 = (size_t)*(int *)(lVar17 + 0x10);
          pcStack_cc8 = (code *)0x1136ce;
          memset(pcVar12,0x78,sVar7);
          *(undefined4 *)(&(pfVar8->kvs_config).create_if_missing + sVar7) = 0x646e653c;
          *(undefined2 *)(auStack_c46 + sVar7 + 4) = 0x3e;
          pcStack_cc8 = (code *)0x1136ee;
          sprintf(pcVar12,*(char **)(lVar17 + 0x20),uVar18);
          doc_01 = pfStack_cb8;
          in_RCX = (fdb_kvs_handle *)pfStack_cb8->op_stats;
          pcStack_cc8 = (code *)0x113706;
          iVar5 = bcmp(in_RCX,afStack_b40,*(size_t *)&pfStack_cb8->kvs_config);
          if (iVar5 != 0) {
            pcStack_cc8 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_cc8 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (fdb_kvs_handle *)(doc_01->field_6).seqtree;
          pcStack_cc8 = (code *)0x113721;
          iVar5 = bcmp(in_RCX,pcVar12,(size_t)(doc_01->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113a88;
          uVar18 = (ulong)((int)uVar18 + 1);
          pcStack_cc8 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)doc_01);
          pcStack_cc8 = (code *)0x11373d;
          fVar4 = fdb_iterator_next(pfStack_cb0);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar18 != *(int *)pp_Stack_c98) {
          pcStack_cc8 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_cc8 = (code *)0x11375c;
        fVar4 = fdb_iterator_close(pfStack_cb0);
        pfVar13 = pfStack_ca0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_cc8 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_ca0 = pfVar13;
    in_RCX = (fdb_kvs_handle *)afStack_b40;
    afStack_b40[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_b40[0].algorithm,"key",4);
    doc_01 = (fdb_kvs_handle *)(auStack_c46 + 6);
    auStack_c46._6_8_ = 0x756c61765f77656e;
    uStack_c38 = 0x65;
    pfVar13 = *(fdb_kvs_handle **)&pfVar8->kvs_config;
    pcStack_cc8 = (code *)0x1137b0;
    sVar7 = strlen((char *)in_RCX);
    unaff_R12 = (char *)(sVar7 + 1);
    pcStack_cc8 = (code *)0x1137bc;
    sVar7 = strlen((char *)doc_01);
    pcStack_cc8 = (code *)0x1137d1;
    fVar4 = fdb_set_kv(pfVar13,in_RCX,(size_t)unaff_R12,doc_01,sVar7 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_cc8 = (code *)0x1137ed;
    fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar8->kvs_config,&pfStack_ca8,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_cc8 = (code *)0x113804;
    fVar4 = fdb_get_kvs_info(pfStack_ca8,&fStack_c80);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (fdb_kvs_handle *)&(pfVar8->kvs_config).custom_cmp;
    if (fStack_c80.last_seqnum != (long)*(int *)&(pfVar8->kvs_config).custom_cmp + 1U) {
      pcStack_cc8 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_cc8 = (code *)0x113842;
    fVar4 = fdb_iterator_init(pfStack_ca8,&pfStack_cb0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar11 = pfVar8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    unaff_R12 = auStack_c46 + 6;
    uVar18 = 0;
    do {
      pfStack_cb8 = (fdb_kvs_handle *)0x0;
      pcStack_cc8 = (code *)0x113874;
      fVar4 = fdb_iterator_get(pfStack_cb0,(fdb_doc **)&pfStack_cb8);
      pfVar8 = pfStack_cb8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar18 < *(int *)in_RCX) {
        lVar17 = CONCAT26(auStack_a00._6_2_,CONCAT24(auStack_a00._4_2_,auStack_a00._0_4_));
        pcStack_cc8 = (code *)0x11389c;
        sprintf((char *)afStack_b40,*(char **)(lVar17 + 0x18),uVar18);
        sVar7 = (size_t)*(int *)(lVar17 + 0x10);
        pcStack_cc8 = (code *)0x1138b0;
        memset(unaff_R12,0x78,sVar7);
        *(undefined4 *)(auStack_c50 + sVar7 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_c46 + sVar7 + 4) = 0x3e;
        pcStack_cc8 = (code *)0x1138d5;
        sprintf(unaff_R12,*(char **)(lVar17 + 0x20),uVar18);
        pfVar8 = pfStack_cb8;
        doc_01 = (fdb_kvs_handle *)pfStack_cb8->op_stats;
        pcStack_cc8 = (code *)0x1138ec;
        iVar5 = bcmp(doc_01,afStack_b40,*(size_t *)&pfStack_cb8->kvs_config);
        if (iVar5 != 0) goto LAB_00113aa8;
        doc_01 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
        pcStack_cc8 = (code *)0x113907;
        iVar5 = bcmp(doc_01,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_b40[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_b40[0].algorithm,"key",4);
        auStack_c46._6_8_ = 0x756c61765f77656e;
        uStack_c38 = 0x65;
        doc_01 = (fdb_kvs_handle *)pfStack_cb8->op_stats;
        pcStack_cc8 = (code *)0x113955;
        iVar5 = bcmp(doc_01,afStack_b40,*(size_t *)&pfStack_cb8->kvs_config);
        if (iVar5 != 0) goto LAB_00113ac8;
        doc_01 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
        pcStack_cc8 = (code *)0x113970;
        iVar5 = bcmp(doc_01,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113a98;
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pcStack_cc8 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_cb8);
      pcStack_cc8 = (code *)0x11398e;
      fVar4 = fdb_iterator_next(pfStack_cb0);
      pfVar11 = pfVar8;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar18 != *(int *)in_RCX + 1) {
      pcStack_cc8 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_cc8 = (code *)0x1139ac;
    fVar4 = fdb_iterator_close(pfStack_cb0);
    pfVar13 = pfStack_ca0;
    pfVar8 = pfStack_ca8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar11 = (fdb_kvs_handle *)afStack_b40;
    pcStack_cc8 = (code *)0x1139ce;
    sVar7 = strlen((char *)pfVar11);
    pcStack_cc8 = (code *)0x1139e7;
    fVar4 = fdb_get_kv(pfVar8,pfVar11,sVar7 + 1,&pfStack_c88,&sStack_c90);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_cc8 = (code *)0x113a09;
    iVar5 = bcmp(pfStack_c88,auStack_c46 + 6,sStack_c90);
    pfVar8 = pfStack_c88;
    if (iVar5 == 0) {
      pcStack_cc8 = (code *)0x113a19;
      fdb_free_block(pfStack_c88);
LAB_00113a19:
      pcStack_cc8 = (code *)0x113a23;
      fdb_kvs_close(pfStack_ca8);
      return;
    }
  }
  pcStack_cc8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1240 = (fdb_iterator *)0x113b3a;
  fStack_ee8.bub_ctx.space_used = (uint64_t)pfVar8;
  fStack_ee8.bub_ctx.handle = (fdb_kvs_handle *)unaff_R12;
  pfStack_ce0 = doc_01;
  pfStack_cd8 = pfVar11;
  pfStack_cd0 = pfVar13;
  pcStack_cc8 = (code *)uVar18;
  gettimeofday(&tStack_1110,(__timezone_ptr_t)0x0);
  pfStack_1240 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_1240 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)&fStack_ee8.config.encryption_key;
  pfStack_1240 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1100;
  pfStack_1240 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_ee8.config.encryption_key.bytes[4] = '\0';
  fStack_ee8.config.encryption_key.bytes[5] = '\0';
  fStack_ee8.config.encryption_key.bytes[6] = '\0';
  fStack_ee8.config.encryption_key.bytes[7] = '\0';
  fStack_ee8.config.encryption_key.bytes[8] = '\0';
  fStack_ee8.config.encryption_key.bytes[9] = '\0';
  fStack_ee8.config.encryption_key.bytes[10] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xb] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xc] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xd] = '\x04';
  fStack_ee8.config.encryption_key.bytes[0xe] = '\0';
  fStack_ee8.config.encryption_key.bytes[0xf] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x10] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x11] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x12] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x13] = '\0';
  fStack_ee8.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_ee8.config._180_4_ = 1;
  fStack_ee8.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1240 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)(auStack_1220 + 0x10);
  pfStack_1240 = (fdb_iterator *)0x113baf;
  fVar4 = fdb_open((fdb_file_handle **)pfVar13,"./mvcc_test1",(fdb_config *)pfVar8);
  doc_02 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1240 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1220._16_8_,&pfStack_1230,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1240 = (fdb_iterator *)0x113bda;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_1240 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1220._8_8_,(fdb_kvs_info *)(apfStack_1170 + 6));
    if ((fdb_kvs_handle *)fStack_1140.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1240 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar13 = (fdb_kvs_handle *)auStack_1220;
    pfStack_1240 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1220._8_8_,(fdb_iterator **)pfVar13,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1240 = (fdb_iterator *)0x113c32;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
    pfVar11 = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_1240 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
    pfStack_1240 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1220._8_8_);
    lVar17 = 0;
    uVar18 = 0;
    do {
      pfStack_1240 = (fdb_iterator *)0x113c71;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_ee8,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113cb9;
      sVar7 = strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x113cc4;
      sVar9 = strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x113ccf;
      sVar10 = strlen((char *)&fStack_ee8);
      pfStack_1240 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_11e8 + lVar17),auStack_1100 + 0x18,sVar7,&fStack_fe8,sVar9
                     ,&fStack_ee8,sVar10);
      pfStack_1240 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_1230,*(fdb_doc **)(auStack_11e8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar18 != 5);
    pfStack_1240 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\x01');
    uVar18 = 5;
    doc_04 = (fdb_doc **)(auStack_11e8 + 0x28);
    do {
      pfStack_1240 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_ee8,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113d8a;
      sVar7 = strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x113d95;
      sVar9 = strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x113da0;
      sVar10 = strlen((char *)&fStack_ee8);
      pfStack_1240 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(doc_04,auStack_1100 + 0x18,sVar7,&fStack_fe8,sVar9,&fStack_ee8,sVar10);
      pfStack_1240 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_1230,*doc_04);
      uVar18 = uVar18 + 1;
      doc_04 = doc_04 + 1;
    } while (uVar18 != 9);
    pfVar8 = (fdb_kvs_handle *)(auStack_1100 + 0x18);
    pfStack_1240 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar8,"key%d",9);
    config = &fStack_fe8;
    pfStack_1240 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar11 = &fStack_ee8;
    pfStack_1240 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar11,"Body%d",9);
    pfVar13 = (fdb_kvs_handle *)(auStack_11e8 + 0x48);
    pfStack_1240 = (fdb_iterator *)0x113e48;
    doc_01 = (fdb_kvs_handle *)strlen((char *)pfVar8);
    pfStack_1240 = (fdb_iterator *)0x113e53;
    doc_02 = (fdb_iterator *)strlen((char *)config);
    pfStack_1240 = (fdb_iterator *)0x113e5e;
    sVar7 = strlen((char *)pfVar11);
    pfStack_1240 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar13,pfVar8,(size_t)doc_01,config,(size_t)doc_02,pfVar11,sVar7);
    pfStack_1240 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    **(undefined1 **)(auStack_11e8._72_8_ + 0x40) = 0x62;
    pfStack_1240 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    pfStack_1200 = *(fdb_kvs_handle **)(auStack_11e8._72_8_ + 0x28);
    pfStack_1240 = (fdb_iterator *)0x113ed7;
    fVar4 = fdb_snapshot_open(pfStack_1230,&pfStack_11f0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_1240 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_1230,(fdb_doc *)auStack_11e8._72_8_);
    pfStack_1240 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    uVar18 = 10;
    pfVar13 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1240 = (fdb_iterator *)0x113f24;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_fe8,"meta%d",uVar18 & 0xffffffff);
      pfVar11 = &fStack_ee8;
      pfStack_1240 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar11,"body%d",uVar18 & 0xffffffff);
      doc_02 = (fdb_iterator *)(auStack_11e8 + (long)pfVar13);
      pfStack_1240 = (fdb_iterator *)0x113f6c;
      pfVar8 = (fdb_kvs_handle *)strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x113f77;
      doc_01 = (fdb_kvs_handle *)strlen((char *)&fStack_fe8);
      pfStack_1240 = (fdb_iterator *)0x113f82;
      sVar7 = strlen((char *)pfVar11);
      pfStack_1240 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_02,auStack_1100 + 0x18,(size_t)pfVar8,&fStack_fe8,
                     (size_t)doc_01,pfVar11,sVar7);
      pfStack_1240 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_1230,*(fdb_doc **)(auStack_11e8 + uVar18 * 8));
      uVar18 = uVar18 + 1;
      pfVar13 = (fdb_kvs_handle *)((long)pfVar13 + 8);
    } while (uVar18 != 0xf);
    pfStack_1240 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\x01');
    pfStack_1240 = (fdb_iterator *)0x113fee;
    fVar4 = fdb_set_log_callback(pfStack_1230,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_1240 = (fdb_iterator *)0x11400a;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),999999);
    pfVar8 = pfStack_1200;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_1240 = (fdb_iterator *)0x11402a;
    fVar4 = fdb_snapshot_open(pfStack_1230,(fdb_kvs_handle **)(auStack_1220 + 8),
                              (fdb_seqnum_t)pfStack_1200);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_1240 = (fdb_iterator *)0x114044;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1220._8_8_,&pfStack_1208,
                              (fdb_seqnum_t)pfVar8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_1240 = (fdb_iterator *)0x114056;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1220._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_1240 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_1208,(fdb_kvs_info *)(apfStack_1170 + 6));
    if ((fdb_kvs_handle *)fStack_1140.last_seqnum != pfVar8) {
      pfStack_1240 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar18 = 0xf;
    config = (fdb_iterator *)apfStack_1170;
    do {
      pfStack_1240 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_1100 + 0x18,"key%d",uVar18 & 0xffffffff);
      doc_02 = &fStack_fe8;
      pfStack_1240 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_02,"meta%d",uVar18 & 0xffffffff);
      pfVar8 = &fStack_ee8;
      pfStack_1240 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar8,"body%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_iterator *)0x1140ef;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_1100 + 0x18);
      pfStack_1240 = (fdb_iterator *)0x1140fa;
      doc_01 = (fdb_kvs_handle *)strlen((char *)doc_02);
      pfStack_1240 = (fdb_iterator *)0x114105;
      sVar7 = strlen((char *)pfVar8);
      pfStack_1240 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_1100 + 0x18,(size_t)pfVar11,doc_02,(size_t)doc_01,
                     pfVar8,sVar7);
      pfStack_1240 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_1230,*(fdb_doc **)config);
      uVar18 = uVar18 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar18 != 0x14);
    pfStack_1240 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_1220._16_8_,'\0');
    pfStack_1240 = (fdb_iterator *)0x114165;
    fVar4 = fdb_snapshot_open(pfStack_11f0,&pfStack_11f8,0xffffffffffffffff);
    pfVar13 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar13 = (fdb_kvs_handle *)&pfStack_1228;
    pfStack_1240 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar13,
                   (void *)(*(size_t **)
                             (auStack_11e8 + (((long)pfStack_1200 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_11e8 + (((long)pfStack_1200 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1240 = (fdb_iterator *)0x1141bd;
    fVar4 = fdb_get_metaonly(pfStack_1208,(fdb_doc *)pfStack_1228);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_1240 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_1228);
    pfStack_1240 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_1228,*(kvs_ops_stat **)(auStack_11e8._40_8_ + 0x20),
                   (size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_11e8._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_1240 = (fdb_iterator *)0x114204;
    fVar4 = fdb_get_metaonly(pfStack_1208,(fdb_doc *)pfStack_1228);
    unaff_R12 = (char *)auStack_11e8._40_8_;
    doc_03 = pfStack_1228;
    pfVar13 = (fdb_kvs_handle *)&pfStack_1228;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar8 = (fdb_kvs_handle *)pfStack_1228->op_stats;
    config = *(fdb_iterator **)(auStack_11e8._40_8_ + 0x20);
    pfStack_1240 = (fdb_iterator *)0x11422e;
    iVar5 = bcmp(pfVar8,config,(size_t)*(fdb_doc **)(fdb_kvs_config *)auStack_11e8._40_8_);
    if (iVar5 != 0) goto LAB_001145cc;
    pfVar8 = (fdb_kvs_handle *)doc_03->staletree;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_1240 = (fdb_iterator *)0x11424f;
    iVar5 = bcmp(pfVar8,config,(size_t)((fdb_kvs_config *)unaff_R12)->custom_cmp);
    if (iVar5 != 0) goto LAB_001145d7;
    pfStack_1240 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_03);
    pfStack_1240 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_1228,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1228->fhandle = (fdb_file_handle *)0x6;
    pfStack_1240 = (fdb_iterator *)0x114295;
    fVar4 = fdb_get_byseq(pfStack_1208,(fdb_doc *)pfStack_1228);
    pfVar13 = pfStack_1228;
    doc_03 = (fdb_kvs_handle *)&pfStack_1228;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar8 = (fdb_kvs_handle *)pfStack_1228->op_stats;
    config = *(fdb_iterator **)(auStack_11e8._40_8_ + 0x20);
    pfStack_1240 = (fdb_iterator *)0x1142be;
    iVar5 = bcmp(pfVar8,config,*(size_t *)&pfStack_1228->kvs_config);
    unaff_R12 = (char *)auStack_11e8._40_8_;
    if (iVar5 != 0) goto LAB_001145e7;
    pfVar8 = (fdb_kvs_handle *)(pfVar13->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_11e8._40_8_ + 0x40))->
             seqtree;
    pfStack_1240 = (fdb_iterator *)0x1142de;
    iVar5 = bcmp(pfVar8,config,(size_t)(pfVar13->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001145f2;
    pfStack_1240 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar13);
    pfVar13 = (fdb_kvs_handle *)&pfStack_1228;
    pfStack_1228 = (fdb_kvs_handle *)0x0;
    doc_01 = (fdb_kvs_handle *)0x0;
    pfStack_1240 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_1208,(fdb_iterator **)auStack_1220,(void *)0x0,0,(void *)0x0,0,0);
    pfVar11 = pfVar8;
    do {
      pfStack_1240 = (fdb_iterator *)0x11432a;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1220._0_8_,(fdb_doc **)pfVar13);
      pfVar8 = pfStack_1228;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_1240 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar8 = pfVar11;
LAB_00114554:
        pfStack_1240 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_1240 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config = (fdb_iterator *)pfStack_1228->op_stats;
      doc_02 = *(fdb_iterator **)(auStack_11e8 + (long)doc_01 * 8);
      unaff_R12 = (char *)doc_02->_seqnum;
      pfStack_1240 = (fdb_iterator *)0x114352;
      iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1228->kvs_config);
      pfVar11 = pfVar8;
      if (iVar5 != 0) {
        pfStack_1240 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)pfVar8->staletree;
      unaff_R12 = (char *)doc_02->tree_cursor_start;
      pfStack_1240 = (fdb_iterator *)0x114371;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0011455f;
      config = (fdb_iterator *)(pfVar8->field_6).seqtree;
      unaff_R12 = (char *)doc_02->tree_cursor_prev;
      pfStack_1240 = (fdb_iterator *)0x114390;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00114554;
      pfStack_1240 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar8);
      pfStack_1228 = (fdb_kvs_handle *)0x0;
      doc_01 = (fdb_kvs_handle *)&(doc_01->kvs_config).field_0x1;
      pfStack_1240 = (fdb_iterator *)0x1143b6;
      pfVar16 = (fdb_iterator *)auStack_1220._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)doc_01 == 10) {
      pfStack_1240 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
      doc_01 = (fdb_kvs_handle *)0x0;
      pfStack_1240 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_11f8,(fdb_iterator **)auStack_1220,(void *)0x0,0,(void *)0x0,0,0);
      pfVar13 = (fdb_kvs_handle *)&pfStack_1228;
      do {
        pfStack_1240 = (fdb_iterator *)0x114408;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1220._0_8_,(fdb_doc **)pfVar13);
        pfVar8 = pfStack_1228;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config = (fdb_iterator *)pfStack_1228->op_stats;
        doc_02 = *(fdb_iterator **)(auStack_11e8 + (long)doc_01 * 8);
        unaff_R12 = (char *)doc_02->_seqnum;
        pfStack_1240 = (fdb_iterator *)0x114430;
        iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1228->kvs_config);
        if (iVar5 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)pfVar8->staletree;
        unaff_R12 = (char *)doc_02->tree_cursor_start;
        pfStack_1240 = (fdb_iterator *)0x11444f;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_00114585;
        config = (fdb_iterator *)(pfVar8->field_6).seqtree;
        unaff_R12 = (char *)doc_02->tree_cursor_prev;
        pfStack_1240 = (fdb_iterator *)0x11446e;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar8->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011457a;
        pfStack_1240 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar8);
        pfStack_1228 = (fdb_kvs_handle *)0x0;
        doc_01 = (fdb_kvs_handle *)&(doc_01->kvs_config).field_0x1;
        pfStack_1240 = (fdb_iterator *)0x114494;
        pfVar16 = (fdb_iterator *)auStack_1220._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1220._0_8_);
        pfVar11 = pfVar8;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)doc_01 == 10) {
        pfStack_1240 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_1220._0_8_);
        pfStack_1240 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_1230);
        pfStack_1240 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_11f0);
        pfStack_1240 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_11f8);
        pfStack_1240 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_1208);
        pfStack_1240 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_1220._16_8_);
        lVar17 = 0;
        do {
          pfStack_1240 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_11e8 + lVar17 * 8));
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x14);
        pfStack_1240 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_1240 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pfStack_1240 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar12,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_1240 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_1240 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar11 = (fdb_kvs_handle *)unaff_R12;
LAB_0011459a:
    pfStack_1240 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_1240 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_1240 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_1240 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_1240 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_1240 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_1240 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_1240 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_1240 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = (char *)pfVar11;
    doc_03 = pfVar13;
    pfStack_1240 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_1240 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_1240 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar13 = doc_03;
    pfStack_1240 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_1240 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_1240 = (fdb_iterator *)0x1145fd;
    pfVar16 = config;
    snapshot_clone_test();
  }
  pfStack_1240 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_1240 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_1298 = (fdb_doc *)0x0;
  pfVar11 = pfVar16->handle;
  iVar5 = *(int *)&pfVar16->seqtree_iterator;
  pfStack_1268 = pfVar13;
  pfStack_1260 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1258 = doc_01;
  pfStack_1250 = pfVar8;
  pfStack_1248 = config;
  pfStack_1240 = doc_02;
  gettimeofday(&tStack_1278,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar16->hbtrie_iterator,&pfStack_1280,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar17 = 0;
  iStack_1284 = iVar5;
  fdb_iterator_init(pfStack_1280,&pfStack_1290,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_1290,&pfStack_1298);
    doc_00 = pfStack_1298;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_1298->key;
    lVar2 = *(long *)(&(pfVar11->kvs_config).create_if_missing + lVar17 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_1298->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc_00->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc_00->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc_00);
    pfStack_1298 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    fVar4 = fdb_iterator_next(pfStack_1290);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_1284 / 2 == (int)lVar17) {
    fdb_iterator_close(pfStack_1290);
    fdb_kvs_close(pfStack_1280);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void in_memory_snapshot_cleanup_test()
{
    TEST_INIT();

    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db1, *snap_db2, *snap_db3;
    fdb_kvs_handle *psnap_db1, *psnap_db2, *psnap_db3;
    fdb_doc *doc = NULL;
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[32];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_cleanup_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "key");
    sprintf(metabuf, "meta");
    sprintf(bodybuf, "body");
    fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_snapshot_open(db, &snap_db1, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &snap_db2, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(doc);

    // Update doc with new Key
    char newKey[32];
    sprintf(newKey, "Key");
    fdb_doc_create(&doc, (void*)newKey, strlen(newKey),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    status = fdb_snapshot_open(db, &snap_db3, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);

    status = fdb_get(snap_db1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db2, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db3, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(rdoc);

    status = fdb_snapshot_open(db, &psnap_db1, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db2, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db3, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close snapshot handle
    fdb_kvs_close(snap_db1);
    fdb_kvs_close(snap_db2);
    fdb_kvs_close(snap_db3);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(psnap_db1);
    fdb_kvs_close(psnap_db2);
    fdb_kvs_close(psnap_db3);

    // close db handle
    fdb_kvs_close(db);

    // close db file
    fdb_close(dbfile);

    fdb_doc_free(doc);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot cleanup test");
}